

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::resize_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          ssize_t sw,ssize_t sh)

{
  invalid_argument *this_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa22;
  uint64_t sb22;
  uint64_t sg22;
  uint64_t sr22;
  uint64_t sa21;
  uint64_t sb21;
  uint64_t sg21;
  uint64_t sr21;
  uint64_t sa12;
  uint64_t sb12;
  uint64_t sg12;
  uint64_t sr12;
  uint64_t sa11;
  uint64_t sb11;
  uint64_t sg11;
  uint64_t sr11;
  double source_x1_factor;
  double source_x2_factor;
  size_t source_x2;
  size_t source_x1;
  double source_x_progress;
  double x_rel_dist;
  ssize_t xx;
  double source_y1_factor;
  double source_y2_factor;
  size_t source_y2;
  size_t source_y1;
  double source_y_progress;
  double y_rel_dist;
  ssize_t yy;
  ssize_t local_38;
  ssize_t h_local;
  ssize_t w_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *source_local;
  Image *this_local;
  
  local_38 = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (ssize_t)source;
  source_local = this;
  if ((0 < w) && (0 < h)) {
    if (sw < 0) {
      sw = get_width(source);
    }
    if (sh < 0) {
      sh = get_height((Image *)x_local);
    }
    for (y_rel_dist = 0.0; (long)y_rel_dist < local_38; y_rel_dist = (double)((long)y_rel_dist + 1))
    {
      source_y_progress = (double)(long)y_rel_dist / (double)(local_38 + -1);
      source_y1 = (size_t)(source_y_progress * (double)(sh + -1));
      uVar1 = (ulong)((double)sy + (double)source_y1);
      source_y2 = uVar1 | (long)(((double)sy + (double)source_y1) - 9.223372036854776e+18) &
                          (long)uVar1 >> 0x3f;
      source_y2_factor = (double)(source_y2 + 1);
      auVar17._8_4_ = (int)(source_y2 >> 0x20);
      auVar17._0_8_ = source_y2;
      auVar17._12_4_ = 0x45300000;
      source_y1_factor =
           (double)source_y1 -
           ((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)source_y2) - 4503599627370496.0));
      xx = (ssize_t)(1.0 - source_y1_factor);
      for (x_rel_dist = 0.0; (long)x_rel_dist < h_local; x_rel_dist = (double)((long)x_rel_dist + 1)
          ) {
        source_x_progress = (double)(long)x_rel_dist / (double)(h_local + -1);
        source_x1 = (size_t)(source_x_progress * (double)(sw + -1));
        uVar1 = (ulong)((double)sx + (double)source_x1);
        source_x2 = uVar1 | (long)(((double)sx + (double)source_x1) - 9.223372036854776e+18) &
                            (long)uVar1 >> 0x3f;
        source_x2_factor = (double)(source_x2 + 1);
        auVar18._8_4_ = (int)(source_x2 >> 0x20);
        auVar18._0_8_ = source_x2;
        auVar18._12_4_ = 0x45300000;
        source_x1_factor =
             (double)source_x1 -
             ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)source_x2) - 4503599627370496.0));
        sr11 = (uint64_t)(1.0 - source_x1_factor);
        sg11 = 0;
        sb11 = 0;
        sa11 = 0;
        sr12 = 0;
        sg12 = 0;
        sb12 = 0;
        sa12 = 0;
        sr21 = 0;
        sg21 = 0;
        sb21 = 0;
        sa21 = 0;
        sr22 = 0;
        sg22 = 0;
        sb22 = 0;
        sa22 = 0;
        dr = 0;
        read_pixel((Image *)x_local,source_x2,source_y2,&sg11,&sb11,&sa11,&sr12);
        if ((source_y1_factor != 0.0) || (NAN(source_y1_factor))) {
          read_pixel((Image *)x_local,source_x2,(ssize_t)source_y2_factor,&sg12,&sb12,&sa12,&sr21);
        }
        if ((source_x1_factor != 0.0) || (NAN(source_x1_factor))) {
          read_pixel((Image *)x_local,(ssize_t)source_x2_factor,source_y2,&sg21,&sb21,&sa21,&sr22);
        }
        if (((source_x1_factor != 0.0) || (NAN(source_x1_factor))) &&
           ((source_y1_factor != 0.0 || (NAN(source_y1_factor))))) {
          read_pixel((Image *)x_local,(ssize_t)source_x2_factor,(ssize_t)source_y2_factor,&sg22,
                     &sb22,&sa22,&dr);
        }
        auVar9._8_4_ = (int)(sg11 >> 0x20);
        auVar9._0_8_ = sg11;
        auVar9._12_4_ = 0x45300000;
        auVar19._8_4_ = (int)(sg12 >> 0x20);
        auVar19._0_8_ = sg12;
        auVar19._12_4_ = 0x45300000;
        auVar20._8_4_ = (int)(sg21 >> 0x20);
        auVar20._0_8_ = sg21;
        auVar20._12_4_ = 0x45300000;
        auVar10._8_4_ = (int)(sg22 >> 0x20);
        auVar10._0_8_ = sg22;
        auVar10._12_4_ = 0x45300000;
        dVar5 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sg22) - 4503599627370496.0)) *
                source_x1_factor * source_y1_factor +
                ((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sg21) - 4503599627370496.0)) *
                source_x1_factor * (double)xx +
                ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sg11) - 4503599627370496.0)) *
                (double)sr11 * (double)xx +
                ((auVar19._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sg12) - 4503599627370496.0)) *
                (double)sr11 * source_y1_factor;
        uVar1 = (ulong)dVar5;
        auVar11._8_4_ = (int)(sb11 >> 0x20);
        auVar11._0_8_ = sb11;
        auVar11._12_4_ = 0x45300000;
        auVar21._8_4_ = (int)(sb12 >> 0x20);
        auVar21._0_8_ = sb12;
        auVar21._12_4_ = 0x45300000;
        auVar22._8_4_ = (int)(sb21 >> 0x20);
        auVar22._0_8_ = sb21;
        auVar22._12_4_ = 0x45300000;
        auVar12._8_4_ = (int)(sb22 >> 0x20);
        auVar12._0_8_ = sb22;
        auVar12._12_4_ = 0x45300000;
        dVar6 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sb22) - 4503599627370496.0)) *
                source_x1_factor * source_y1_factor +
                ((auVar22._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sb21) - 4503599627370496.0)) *
                source_x1_factor * (double)xx +
                ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sb11) - 4503599627370496.0)) *
                (double)sr11 * (double)xx +
                ((auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sb12) - 4503599627370496.0)) *
                (double)sr11 * source_y1_factor;
        uVar2 = (ulong)dVar6;
        auVar13._8_4_ = (int)(sa11 >> 0x20);
        auVar13._0_8_ = sa11;
        auVar13._12_4_ = 0x45300000;
        auVar23._8_4_ = (int)(sa12 >> 0x20);
        auVar23._0_8_ = sa12;
        auVar23._12_4_ = 0x45300000;
        auVar24._8_4_ = (int)(sa21 >> 0x20);
        auVar24._0_8_ = sa21;
        auVar24._12_4_ = 0x45300000;
        auVar14._8_4_ = (int)(sa22 >> 0x20);
        auVar14._0_8_ = sa22;
        auVar14._12_4_ = 0x45300000;
        dVar7 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa22) - 4503599627370496.0)) *
                source_x1_factor * source_y1_factor +
                ((auVar24._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa21) - 4503599627370496.0)) *
                source_x1_factor * (double)xx +
                ((auVar13._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa11) - 4503599627370496.0)) *
                (double)sr11 * (double)xx +
                ((auVar23._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa12) - 4503599627370496.0)) *
                (double)sr11 * source_y1_factor;
        uVar3 = (ulong)dVar7;
        auVar15._8_4_ = (int)(sr12 >> 0x20);
        auVar15._0_8_ = sr12;
        auVar15._12_4_ = 0x45300000;
        auVar25._8_4_ = (int)(sr21 >> 0x20);
        auVar25._0_8_ = sr21;
        auVar25._12_4_ = 0x45300000;
        auVar26._8_4_ = (int)(sr22 >> 0x20);
        auVar26._0_8_ = sr22;
        auVar26._12_4_ = 0x45300000;
        auVar16._8_4_ = (int)(dr >> 0x20);
        auVar16._0_8_ = dr;
        auVar16._12_4_ = 0x45300000;
        dVar8 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)dr) - 4503599627370496.0)) *
                source_x1_factor * source_y1_factor +
                ((auVar26._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sr22) - 4503599627370496.0)) *
                source_x1_factor * (double)xx +
                ((auVar15._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sr12) - 4503599627370496.0)) *
                (double)sr11 * (double)xx +
                ((auVar25._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sr21) - 4503599627370496.0)) *
                (double)sr11 * source_y1_factor;
        uVar4 = (ulong)dVar8;
        write_pixel(this,y_local + (long)x_rel_dist,w_local + (long)y_rel_dist,
                    uVar1 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f,
                    uVar2 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f,
                    uVar3 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f,
                    uVar4 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
      }
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::invalid_argument::invalid_argument(this_00,"source width/height must be specified");
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void Image::resize_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, ssize_t sw, ssize_t sh) {
  if (w <= 0 || h <= 0) {
    throw invalid_argument("source width/height must be specified");
  }
  if (sw < 0) {
    sw = source.get_width();
  }
  if (sh < 0) {
    sh = source.get_height();
  }

  for (ssize_t yy = 0; yy < h; yy++) {
    double y_rel_dist = static_cast<double>(yy) / (h - 1);
    double source_y_progress = y_rel_dist * (sh - 1);
    size_t source_y1 = sy + source_y_progress;
    size_t source_y2 = source_y1 + 1;
    double source_y2_factor = source_y_progress - source_y1;
    double source_y1_factor = 1.0 - source_y2_factor;

    for (ssize_t xx = 0; xx < w; xx++) {
      double x_rel_dist = static_cast<double>(xx) / (w - 1);
      double source_x_progress = x_rel_dist * (sw - 1);
      size_t source_x1 = sx + source_x_progress;
      size_t source_x2 = source_x1 + 1;
      double source_x2_factor = source_x_progress - source_x1;
      double source_x1_factor = 1.0 - source_x2_factor;

      uint64_t sr11 = 0, sg11 = 0, sb11 = 0, sa11 = 0;
      uint64_t sr12 = 0, sg12 = 0, sb12 = 0, sa12 = 0;
      uint64_t sr21 = 0, sg21 = 0, sb21 = 0, sa21 = 0;
      uint64_t sr22 = 0, sg22 = 0, sb22 = 0, sa22 = 0;
      source.read_pixel(source_x1, source_y1, &sr11, &sg11, &sb11, &sa11);
      if (source_y2_factor != 0.0) {
        source.read_pixel(source_x1, source_y2, &sr12, &sg12, &sb12, &sa12);
      }
      if (source_x2_factor != 0.0) {
        source.read_pixel(source_x2, source_y1, &sr21, &sg21, &sb21, &sa21);
      }
      if (source_x2_factor != 0.0 && source_y2_factor != 0.0) {
        source.read_pixel(source_x2, source_y2, &sr22, &sg22, &sb22, &sa22);
      }

      uint64_t dr = sr11 * (source_x1_factor * source_y1_factor) +
          sr12 * (source_x1_factor * source_y2_factor) +
          sr21 * (source_x2_factor * source_y1_factor) +
          sr22 * (source_x2_factor * source_y2_factor);
      uint64_t dg = sg11 * (source_x1_factor * source_y1_factor) +
          sg12 * (source_x1_factor * source_y2_factor) +
          sg21 * (source_x2_factor * source_y1_factor) +
          sg22 * (source_x2_factor * source_y2_factor);
      uint64_t db = sb11 * (source_x1_factor * source_y1_factor) +
          sb12 * (source_x1_factor * source_y2_factor) +
          sb21 * (source_x2_factor * source_y1_factor) +
          sb22 * (source_x2_factor * source_y2_factor);
      uint64_t da = sa11 * (source_x1_factor * source_y1_factor) +
          sa12 * (source_x1_factor * source_y2_factor) +
          sa21 * (source_x2_factor * source_y1_factor) +
          sa22 * (source_x2_factor * source_y2_factor);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}